

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O2

bool __thiscall
ASDCP::MXF::
FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
::Unarchive(FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
            *this,MemIOReader *Reader)

{
  bool bVar1;
  ui32_t i;
  uint uVar2;
  ui32_t item_count;
  ui32_t item_size;
  value_type tmp_item;
  uint local_48;
  ui32_t local_44;
  DeltaEntry local_40;
  
  bVar1 = Kumu::MemIOReader::ReadUi32BE(Reader,&local_48);
  if ((!bVar1) || (bVar1 = Kumu::MemIOReader::ReadUi32BE(Reader,&local_44), !bVar1)) {
    return false;
  }
  uVar2 = 0;
  if ((local_48 != 0) && (local_44 != 6)) {
    return false;
  }
  bVar1 = true;
  while( true ) {
    if (bVar1 == false) {
      return false;
    }
    if (local_48 <= uVar2) break;
    local_40.super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00216b70;
    local_40.PosTableIndex = '\0';
    local_40.Slice = '\0';
    local_40.ElementData = 0;
    bVar1 = IndexTableSegment::DeltaEntry::Unarchive(&local_40,Reader);
    if (bVar1) {
      std::
      vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
      ::push_back(&this->
                   super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                  ,&local_40);
    }
    uVar2 = uVar2 + 1;
  }
  return bVar1;
}

Assistant:

bool Unarchive(Kumu::MemIOReader* Reader) {
	    ui32_t item_count, item_size;
	    if ( ! Reader->ReadUi32BE(&item_count) ) return false;
	    if ( ! Reader->ReadUi32BE(&item_size) ) return false;

	    if ( item_count > 0 )
	      {
		if ( this->ItemSize() != item_size ) return false;
	      }

	    bool result = true;
	    for ( ui32_t i = 0; i < item_count && result; ++i )
	      {
		typename ContainerType::value_type tmp_item;
		result = tmp_item.Unarchive(Reader);

		if ( result )
		  {
		    this->push_back(tmp_item);
		  }
	      }

	    return result;
	  }